

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stage.cc
# Opt level: O2

bool __thiscall
tinyusdz::Stage::find_prim_by_prim_id(Stage *this,uint64_t prim_id,Prim **prim,string *err)

{
  map<unsigned_long,_const_tinyusdz::Prim_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_const_tinyusdz::Prim_*>_>_>
  *this_00;
  pointer pPVar1;
  Prim *pPVar2;
  iterator iVar3;
  mapped_type *ppPVar4;
  bool bVar5;
  string *in_R8;
  pointer root;
  bool bVar6;
  Prim *p;
  uint64_t local_40;
  Prim *local_38;
  
  local_40 = prim_id;
  if (prim_id == 0) {
    if (err != (string *)0x0) {
      std::__cxx11::string::assign((char *)err);
    }
    bVar5 = false;
  }
  else {
    this_00 = &this->_prim_id_cache;
    if (this->_prim_id_dirty == true) {
      std::
      _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_const_tinyusdz::Prim_*>,_std::_Select1st<std::pair<const_unsigned_long,_const_tinyusdz::Prim_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_const_tinyusdz::Prim_*>_>_>
      ::clear(&this_00->_M_t);
      this->_prim_id_dirty = false;
    }
    else {
      iVar3 = std::
              _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_const_tinyusdz::Prim_*>,_std::_Select1st<std::pair<const_unsigned_long,_const_tinyusdz::Prim_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_const_tinyusdz::Prim_*>_>_>
              ::find(&this_00->_M_t,&local_40);
      if ((_Rb_tree_header *)iVar3._M_node !=
          &(this->_prim_id_cache)._M_t._M_impl.super__Rb_tree_header) {
        *prim = (Prim *)iVar3._M_node[1]._M_parent;
        return true;
      }
    }
    local_38 = (mapped_type)0x0;
    root = (this->_root_nodes).super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>.
           _M_impl.super__Vector_impl_data._M_start;
    pPVar1 = (this->_root_nodes).super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    do {
      bVar6 = root == pPVar1;
      bVar5 = !bVar6;
      if (bVar6) {
        return bVar5;
      }
      bVar6 = anon_unknown_28::FindPrimByPrimIdRec(local_40,root,&local_38,0,in_R8);
      pPVar2 = local_38;
      root = root + 1;
    } while (!bVar6);
    ppPVar4 = std::
              map<unsigned_long,_const_tinyusdz::Prim_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_const_tinyusdz::Prim_*>_>_>
              ::operator[](this_00,&local_40);
    *ppPVar4 = pPVar2;
    *prim = local_38;
  }
  return bVar5;
}

Assistant:

bool Stage::find_prim_by_prim_id(const uint64_t prim_id, const Prim *&prim,
                                 std::string *err) const {
  if (prim_id < 1) {
    if (err) {
      (*err) = "Input prim_id must be 1 or greater.";
    }
    return false;
  }

  if (_prim_id_dirty) {
    DCOUT("clear prim_id cache.");
    // Clear cache.
    _prim_id_cache.clear();

    _prim_id_dirty = false;
  } else {
    // First find from a cache.
    auto ret = _prim_id_cache.find(prim_id);
    if (ret != _prim_id_cache.end()) {
      DCOUT("Found cache.");
      prim = ret->second;
      return true;
    }
  }

  const Prim *p{nullptr};
  for (const auto &root : root_prims()) {
    if (FindPrimByPrimIdRec(prim_id, &root, &p, 0, err)) {
      _prim_id_cache[prim_id] = p;
      prim = p;
      return true;
    }
  }

  return false;
}